

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

bool __thiscall
Js::InlineCache::PretendTryGetProperty
          (InlineCache *this,Type *type,PropertyCacheOperationInfo *operationInfo)

{
  Type *pTVar1;
  Type *pTVar2;
  code *pcVar3;
  SlotType SVar4;
  SlotType SVar5;
  bool bVar6;
  undefined4 *puVar7;
  CacheType CVar8;
  Type *pTVar9;
  
  pTVar1 = (this->u).local.type;
  CVar8 = CacheType_Local;
  SVar5 = SlotType_Inline;
  if (pTVar1 != type) {
    pTVar9 = (Type *)((ulong)type | 4);
    if (pTVar1 == pTVar9) {
      SVar5 = SlotType_Aux;
      CVar8 = CacheType_Local;
    }
    else {
      pTVar1 = (this->u).local.typeWithoutProperty;
      SVar4 = SlotType_Inline;
      if (pTVar1 != type) {
        SVar5 = SlotType_Aux;
        SVar4 = SlotType_Aux;
        if (pTVar1 != pTVar9) {
          pTVar2 = (Type *)(this->u).proto.prototypeObject;
          if (pTVar2 == type) {
            CVar8 = CacheType_Getter;
            SVar5 = SlotType_Inline;
            if (((ulong)pTVar1 & 2) != 0) goto LAB_00970eef;
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                        ,0xee,"(u.accessor.flags & InlineCacheGetterFlag)",
                                        "u.accessor.flags & InlineCacheGetterFlag");
            if (!bVar6) goto LAB_00970fbb;
            SVar5 = SlotType_Inline;
          }
          else {
            if (pTVar2 != pTVar9) {
              return false;
            }
            CVar8 = CacheType_Getter;
            if (((ulong)pTVar1 & 2) != 0) goto LAB_00970eef;
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                        ,0xf7,"(u.accessor.flags & InlineCacheGetterFlag)",
                                        "u.accessor.flags & InlineCacheGetterFlag");
            if (!bVar6) {
LAB_00970fbb:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            SVar5 = SlotType_Aux;
          }
          *puVar7 = 0;
          CVar8 = CacheType_Getter;
          goto LAB_00970eef;
        }
      }
      SVar5 = SVar4;
      CVar8 = CacheType_Proto;
    }
  }
LAB_00970eef:
  operationInfo->cacheType = CVar8;
  operationInfo->slotType = SVar5;
  return true;
}

Assistant:

bool InlineCache::PretendTryGetProperty(Type *const type, PropertyCacheOperationInfo * operationInfo) const
    {
        if (type == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.local.type)
        {
            operationInfo->cacheType = CacheType_Local;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.proto.type)
        {
            operationInfo->cacheType = CacheType_Proto;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        if (type == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Inline;
            return true;
        }

        if (TypeWithAuxSlotTag(type) == u.accessor.type)
        {
            Assert(u.accessor.flags & InlineCacheGetterFlag);

            operationInfo->cacheType = CacheType_Getter;
            operationInfo->slotType = SlotType_Aux;
            return true;
        }

        return false;
    }